

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

void __thiscall spectest::CommandRunner::CommandRunner(CommandRunner *this)

{
  _Rb_tree_header *p_Var1;
  mapped_type *this_00;
  CommandRunner *store;
  size_type sVar2;
  _func_void *p_Var3;
  mapped_type *pmVar4;
  undefined4 uVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar6;
  anon_struct_72_2_3f8ecaa8 *paVar7;
  Value value;
  Value value_00;
  Value value_01;
  Value value_02;
  undefined4 local_54c;
  mapped_type *local_548;
  CommandRunner *local_540;
  string import_name;
  key_type local_518;
  _Any_data local_4f8;
  code *local_4e8;
  code *pcStack_4e0;
  key_type local_4d8;
  anon_struct_72_2_3f8ecaa8 local_4b8;
  Ptr local_470;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_458;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_438;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_418;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3f8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3d8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_3b8;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_398;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_378;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_338;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined **local_2d8;
  undefined4 local_2d0;
  undefined8 local_2cc;
  undefined **local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b4;
  undefined **local_2a8;
  undefined4 local_2a0;
  undefined8 local_29c;
  undefined **local_290;
  undefined4 local_288;
  undefined8 local_284;
  MemoryType local_278;
  undefined1 local_250 [16];
  pointer local_240;
  pointer local_238;
  undefined2 local_230;
  anon_struct_72_2_3f8ecaa8 print_funcs [6];
  FuncType local_70;
  
  wabt::interp::Store::Store(&this->store_,&s_features);
  p_Var1 = &(this->registry_)._M_t._M_impl.super__Rb_tree_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->registry_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->instances_)._M_t._M_impl.super__Rb_tree_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->instances_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->last_instance_)._M_t._M_impl.super__Rb_tree_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->last_instance_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->passed_ = 0;
  this->total_ = 0;
  (this->source_filename_)._M_dataplus._M_p = (pointer)&(this->source_filename_).field_2;
  (this->source_filename_)._M_string_length = 0;
  (this->source_filename_).field_2._M_local_buf[0] = '\0';
  local_540 = this;
  std::__cxx11::string::string((string *)print_funcs,"spectest",(allocator *)&local_4d8);
  local_548 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>_>_>_>
              ::operator[](&this->registry_,(key_type *)print_funcs);
  std::__cxx11::string::_M_dispose();
  print_funcs[0].name = "print";
  local_398._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_398._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[0].type,(ValueTypes *)&local_398,(ValueTypes *)&local_3b8);
  print_funcs[1].name = "print_i32";
  local_518._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_3d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_3d8,&local_518);
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[1].type,(ValueTypes *)&local_3d8,(ValueTypes *)&local_3f8);
  print_funcs[2].name = "print_f32";
  local_470.obj_._0_4_ = 0xfffffffd;
  local_418._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_418._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_418._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_418,&local_470);
  local_438._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_438._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[2].type,(ValueTypes *)&local_418,(ValueTypes *)&local_438);
  print_funcs[3].name = "print_f64";
  local_54c = 0xfffffffc;
  local_2f8 = 0;
  uStack_2f0 = 0;
  local_2e8 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_2f8,&local_54c);
  local_458._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_458._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[3].type,(ValueTypes *)&local_2f8,(ValueTypes *)&local_458);
  print_funcs[4].name = "print_i32_f32";
  local_4d8._M_dataplus._M_p = (pointer)0xfffffffdffffffff;
  local_318 = 0;
  uStack_310 = 0;
  local_308 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_318,&local_4d8,
             &local_4d8._M_string_length);
  local_338._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_338._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[4].type,(ValueTypes *)&local_318,(ValueTypes *)&local_338);
  print_funcs[5].name = "print_f64_f64";
  import_name._M_dataplus._M_p = (pointer)0xfffffffcfffffffc;
  local_358 = 0;
  uStack_350 = 0;
  local_348 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_358,&import_name);
  local_378._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::interp::FuncType::FuncType
            (&print_funcs[5].type,(ValueTypes *)&local_358,(ValueTypes *)&local_378);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_378);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_358);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_338);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_318);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_458);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_2f8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_438);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_418);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3f8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3d8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_3b8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_398);
  for (lVar6 = 0; store = local_540, lVar6 != 0x1b0; lVar6 = lVar6 + 0x48) {
    paVar7 = (anon_struct_72_2_3f8ecaa8 *)((long)&print_funcs[0].name + lVar6);
    wabt::StringPrintf_abi_cxx11_(&import_name,"spectest.%s",paVar7->name);
    wabt::interp::FuncType::FuncType
              (&local_70,
               (FuncType *)((long)&print_funcs[0].type.super_ExternType._vptr_ExternType + lVar6));
    std::__cxx11::string::string((string *)&local_4d8,(string *)&import_name);
    CommandRunner()::$_1::__1((__1 *)&local_4b8,paVar7);
    local_4e8 = (code *)0x0;
    pcStack_4e0 = (code *)0x0;
    local_4f8._M_unused._M_object = (void *)0x0;
    local_4f8._8_8_ = 0;
    p_Var3 = (_func_void *)operator_new(0x68);
    sVar2 = local_4d8._M_string_length;
    *(_func_void **)p_Var3 = p_Var3 + 0x10;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d8._M_dataplus._M_p == &local_4d8.field_2) {
      *(ulong *)(p_Var3 + 0x10) =
           CONCAT71(local_4d8.field_2._M_allocated_capacity._1_7_,local_4d8.field_2._M_local_buf[0])
      ;
      *(undefined8 *)(p_Var3 + 0x18) = local_4d8.field_2._8_8_;
    }
    else {
      *(pointer *)p_Var3 = local_4d8._M_dataplus._M_p;
      *(ulong *)(p_Var3 + 0x10) =
           CONCAT71(local_4d8.field_2._M_allocated_capacity._1_7_,local_4d8.field_2._M_local_buf[0])
      ;
    }
    local_4d8._M_string_length = 0;
    *(size_type *)(p_Var3 + 8) = sVar2;
    local_4d8.field_2._M_local_buf[0] = '\0';
    local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
    CommandRunner()::$_1::__1((__1 *)(p_Var3 + 0x20),&local_4b8);
    pcStack_4e0 = std::
                  _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:1227:9)>
                  ::_M_invoke;
    local_4e8 = std::
                _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/tools/spectest-interp.cc:1227:9)>
                ::_M_manager;
    local_4f8._M_unused._0_8_ = p_Var3;
    wabt::interp::HostFunc::New(&local_470,&local_540->store_,&local_70,(Callback *)&local_4f8);
    std::__cxx11::string::string((string *)&local_518,paVar7->name,(allocator *)&local_54c);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
             ::operator[](local_548,&local_518);
    wabt::interp::RefPtr<wabt::interp::Extern>::operator=(pmVar4,&local_470);
    std::__cxx11::string::_M_dispose();
    wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&local_470);
    if (local_4e8 != (code *)0x0) {
      (*local_4e8)(&local_4f8,&local_4f8,__destroy_functor);
    }
    CommandRunner()::$_0::~__0((__0 *)&local_4d8);
    wabt::interp::FuncType::~FuncType(&local_70);
    std::__cxx11::string::_M_dispose();
  }
  local_250._8_8_ = (pointer)0xfffffff000000001;
  local_250._0_8_ = &PTR__ExternType_00228510;
  local_240 = (pointer)0xa;
  local_238 = (pointer)0x14;
  local_230._0_1_ = true;
  local_230._1_1_ = false;
  wabt::interp::Table::New((Ptr *)&import_name,&local_540->store_,(TableType *)local_250);
  std::__cxx11::string::string((string *)&local_4d8,"table",(allocator *)&local_518);
  this_00 = local_548;
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](local_548,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Table> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Table>::reset((RefPtr<wabt::interp::Table> *)&import_name);
  local_278.super_ExternType.kind = Memory;
  local_278.super_ExternType._vptr_ExternType = (_func_int **)&PTR__ExternType_00228550;
  local_278.limits.initial = 1;
  local_278.limits.max = 2;
  local_278.limits.has_max = true;
  local_278.limits.is_shared = false;
  wabt::interp::Memory::New((Ptr *)&import_name,&store->store_,&local_278);
  std::__cxx11::string::string((string *)&local_4d8,"memory",(allocator *)&local_518);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Memory> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Memory>::reset((RefPtr<wabt::interp::Memory> *)&import_name);
  uVar5._0_1_ = true;
  uVar5._1_1_ = false;
  uVar5._2_1_ = false;
  uVar5._3_1_ = false;
  local_290 = &PTR__ExternType_00228590;
  local_284 = 0xffffffff;
  value._8_8_ = in_R9;
  value.i64_ = in_R8;
  local_288 = uVar5;
  wabt::interp::Global::New
            ((Ptr *)&import_name,(Global *)store,(Store *)&local_290,(GlobalType *)0x29a,value);
  std::__cxx11::string::string((string *)&local_4d8,"global_i32",(allocator *)&local_518);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2a8 = &PTR__ExternType_00228590;
  local_29c = 0xfffffffe;
  value_00._8_8_ = in_R9;
  value_00.i64_ = in_R8;
  local_2a0 = uVar5;
  wabt::interp::Global::New
            ((Ptr *)&import_name,(Global *)store,(Store *)&local_2a8,(GlobalType *)0x29a,value_00);
  std::__cxx11::string::string((string *)&local_4d8,"global_i64",(allocator *)&local_518);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2c0 = &PTR__ExternType_00228590;
  local_2b4 = 0xfffffffd;
  value_01._8_8_ = in_R9;
  value_01.i64_ = in_R8;
  local_2b8 = uVar5;
  wabt::interp::Global::New
            ((Ptr *)&import_name,(Global *)store,(Store *)&local_2c0,(GlobalType *)0x44268000,
             value_01);
  std::__cxx11::string::string((string *)&local_4d8,"global_f32",(allocator *)&local_518);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  local_2d8 = &PTR__ExternType_00228590;
  local_2cc = 0xfffffffc;
  value_02._8_8_ = in_R9;
  value_02.i64_ = in_R8;
  local_2d0 = uVar5;
  wabt::interp::Global::New
            ((Ptr *)&import_name,(Global *)store,(Store *)&local_2d8,
             (GlobalType *)0x4084d00000000000,value_02);
  std::__cxx11::string::string((string *)&local_4d8,"global_f64",(allocator *)&local_518);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::interp::RefPtr<wabt::interp::Extern>_>_>_>
           ::operator[](this_00,&local_4d8);
  wabt::interp::RefPtr<wabt::interp::Extern>::operator=
            (pmVar4,(RefPtr<wabt::interp::Global> *)&import_name);
  std::__cxx11::string::_M_dispose();
  wabt::interp::RefPtr<wabt::interp::Global>::reset((RefPtr<wabt::interp::Global> *)&import_name);
  lVar6 = 0x170;
  do {
    wabt::interp::FuncType::~FuncType((FuncType *)((long)&print_funcs[0].name + lVar6));
    lVar6 = lVar6 + -0x48;
  } while (lVar6 != -0x40);
  return;
}

Assistant:

CommandRunner::CommandRunner() : store_(s_features) {
  auto&& spectest = registry_["spectest"];

  // Initialize print functions for the spec test.
  struct {
    const char* name;
    interp::FuncType type;
  } const print_funcs[] = {
      {"print", interp::FuncType{{}, {}}},
      {"print_i32", interp::FuncType{{ValueType::I32}, {}}},
      {"print_f32", interp::FuncType{{ValueType::F32}, {}}},
      {"print_f64", interp::FuncType{{ValueType::F64}, {}}},
      {"print_i32_f32", interp::FuncType{{ValueType::I32, ValueType::F32}, {}}},
      {"print_f64_f64", interp::FuncType{{ValueType::F64, ValueType::F64}, {}}},
  };

  for (auto&& print : print_funcs) {
    auto import_name = StringPrintf("spectest.%s", print.name);
    spectest[print.name] = HostFunc::New(
        store_, print.type,
        [=](const Values& params, Values& results, Trap::Ptr* trap) -> wabt::Result {
          printf("called host ");
          WriteCall(s_stdout_stream.get(), import_name, print.type, params,
                    results, *trap);
          return wabt::Result::Ok;
        });
  }

  spectest["table"] =
      interp::Table::New(store_, TableType{ValueType::Funcref, Limits{10, 20}});

  spectest["memory"] = interp::Memory::New(store_, MemoryType{Limits{1, 2}});

  spectest["global_i32"] = interp::Global::New(
      store_, GlobalType{ValueType::I32, Mutability::Const}, Value::Make(u32{666}));
  spectest["global_i64"] = interp::Global::New(
      store_, GlobalType{ValueType::I64, Mutability::Const}, Value::Make(u64{666}));
  spectest["global_f32"] = interp::Global::New(
      store_, GlobalType{ValueType::F32, Mutability::Const}, Value::Make(f32{666}));
  spectest["global_f64"] = interp::Global::New(
      store_, GlobalType{ValueType::F64, Mutability::Const}, Value::Make(f64{666}));
}